

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool GetTypeConstructorFunctions
               (ExpressionContext *ctx,TypeBase *type,bool noArguments,
               SmallArray<FunctionData_*,_32U> *functions)

{
  bool bVar1;
  uint uVar2;
  TypeClass *classType_00;
  bool_type bVar3;
  FunctionData *pFVar4;
  ArgumentData *pAVar5;
  ArrayView<FunctionData_*> functions_00;
  ArrayView<FunctionData_*> functions_01;
  ArrayView<FunctionData_*> functions_02;
  ArrayView<FunctionData_*> functions_03;
  FunctionLookupChain local_1a0;
  FunctionData *local_188;
  ArrayView<FunctionData*> local_180 [16];
  undefined1 local_170 [8];
  FunctionLookupChain chain_3;
  InplaceStr functionName_2;
  undefined1 auStack_140 [4];
  uint hash_2;
  FunctionData *local_128;
  ArrayView<FunctionData*> local_120 [16];
  undefined1 local_110 [8];
  FunctionLookupChain chain_2;
  FunctionData *local_e0;
  ArrayView<FunctionData*> local_d8 [16];
  undefined1 local_c8 [8];
  FunctionLookupChain chain_1;
  InplaceStr functionName_1;
  undefined1 auStack_98 [4];
  uint hash_1;
  FunctionData *local_80;
  ArrayView<FunctionData*> local_78 [16];
  undefined1 local_68 [8];
  FunctionLookupChain chain;
  InplaceStr functionName;
  TypeGenericClassProto *pTStack_38;
  uint hash;
  TypeGenericClassProto *typeGenericClassProto;
  TypeClass *classType;
  SmallArray<FunctionData_*,_32U> *functions_local;
  bool noArguments_local;
  TypeBase *type_local;
  ExpressionContext *ctx_local;
  
  classType_00 = getType<TypeClass>(type);
  pTStack_38 = getType<TypeGenericClassProto>(type);
  if ((classType_00 != (TypeClass *)0x0) && (classType_00->proto != (TypeGenericClassProto *)0x0)) {
    pTStack_38 = classType_00->proto;
  }
  uVar2 = NULLC::StringHashContinue(type->nameHash,"::");
  if (classType_00 == (TypeClass *)0x0) {
    functionName.end._4_4_ = NULLC::StringHashContinue(uVar2,(type->name).begin,(type->name).end);
  }
  else {
    join_0x00000010_0x00000000_ = GetTypeConstructorName(classType_00);
    functionName.end._4_4_ = NULLC::StringHashContinue(uVar2,(char *)chain.scope,functionName.begin)
    ;
  }
  anon_unknown.dwarf_6f1cc::LookupFunctionChainByName
            ((FunctionLookupChain *)local_68,ctx,functionName.end._4_4_);
  while (bVar3 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                           ((FunctionLookupChain *)local_68), bVar3 != 0) {
    if (noArguments) {
      pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator->
                         ((FunctionLookupChain *)local_68);
      bVar1 = SmallArray<ArgumentData,_4U>::empty(&pFVar4->arguments);
      if (bVar1) goto LAB_001a776c;
      pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator->
                         ((FunctionLookupChain *)local_68);
      pAVar5 = SmallArray<ArgumentData,_4U>::operator[](&pFVar4->arguments,0);
      if (pAVar5->value != (ExprBase *)0x0) goto LAB_001a776c;
    }
    else {
LAB_001a776c:
      pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator->
                         ((FunctionLookupChain *)local_68);
      if (pFVar4->scope->ownerType == type) {
        ArrayView<FunctionData*>::ArrayView<32u>(local_78,functions);
        pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator*
                           ((FunctionLookupChain *)local_68);
        functions_00._12_4_ = 0;
        functions_00._0_12_ = local_78._0_12_;
        bVar1 = ContainsSameOverload(functions_00,pFVar4);
        if (!bVar1) {
          local_80 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator*
                               ((FunctionLookupChain *)local_68);
          SmallArray<FunctionData_*,_32U>::push_back(functions,&local_80);
        }
      }
    }
    anon_unknown.dwarf_6f1cc::FunctionLookupChain::next
              ((FunctionLookupChain *)auStack_98,(FunctionLookupChain *)local_68);
  }
  if (pTStack_38 != (TypeGenericClassProto *)0x0) {
    uVar2 = NULLC::StringHashContinue((pTStack_38->super_TypeBase).nameHash,"::");
    join_0x00000010_0x00000000_ = GetTypeConstructorName(pTStack_38);
    uVar2 = NULLC::StringHashContinue(uVar2,(char *)chain_1.scope,functionName_1.begin);
    anon_unknown.dwarf_6f1cc::LookupFunctionChainByName((FunctionLookupChain *)local_c8,ctx,uVar2);
    while (bVar3 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                             ((FunctionLookupChain *)local_c8), bVar3 != 0) {
      if (noArguments) {
        pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator->
                           ((FunctionLookupChain *)local_c8);
        bVar1 = SmallArray<ArgumentData,_4U>::empty(&pFVar4->arguments);
        if (bVar1) goto LAB_001a78d6;
        pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator->
                           ((FunctionLookupChain *)local_c8);
        pAVar5 = SmallArray<ArgumentData,_4U>::operator[](&pFVar4->arguments,0);
        if (pAVar5->value != (ExprBase *)0x0) goto LAB_001a78d6;
      }
      else {
LAB_001a78d6:
        ArrayView<FunctionData*>::ArrayView<32u>(local_d8,functions);
        pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator*
                           ((FunctionLookupChain *)local_c8);
        functions_01._12_4_ = 0;
        functions_01._0_12_ = local_d8._0_12_;
        bVar1 = ContainsSameOverload(functions_01,pFVar4);
        if (!bVar1) {
          local_e0 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator*
                               ((FunctionLookupChain *)local_c8);
          SmallArray<FunctionData_*,_32U>::push_back(functions,&local_e0);
        }
      }
      anon_unknown.dwarf_6f1cc::FunctionLookupChain::next
                ((FunctionLookupChain *)&chain_2.scope,(FunctionLookupChain *)local_c8);
    }
  }
  uVar2 = NULLC::StringHashContinue(functionName.end._4_4_,"$");
  anon_unknown.dwarf_6f1cc::LookupFunctionChainByName((FunctionLookupChain *)local_110,ctx,uVar2);
  while (bVar3 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                           ((FunctionLookupChain *)local_110), bVar3 != 0) {
    if (noArguments) {
      pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator->
                         ((FunctionLookupChain *)local_110);
      bVar1 = SmallArray<ArgumentData,_4U>::empty(&pFVar4->arguments);
      if (bVar1) goto LAB_001a7a0f;
      pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator->
                         ((FunctionLookupChain *)local_110);
      pAVar5 = SmallArray<ArgumentData,_4U>::operator[](&pFVar4->arguments,0);
      if (pAVar5->value != (ExprBase *)0x0) goto LAB_001a7a0f;
    }
    else {
LAB_001a7a0f:
      pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator->
                         ((FunctionLookupChain *)local_110);
      if (pFVar4->scope->ownerType == type) {
        ArrayView<FunctionData*>::ArrayView<32u>(local_120,functions);
        pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator*
                           ((FunctionLookupChain *)local_110);
        functions_02._12_4_ = 0;
        functions_02._0_12_ = local_120._0_12_;
        bVar1 = ContainsSameOverload(functions_02,pFVar4);
        if (!bVar1) {
          local_128 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator*
                                ((FunctionLookupChain *)local_110);
          SmallArray<FunctionData_*,_32U>::push_back(functions,&local_128);
        }
      }
    }
    anon_unknown.dwarf_6f1cc::FunctionLookupChain::next
              ((FunctionLookupChain *)auStack_140,(FunctionLookupChain *)local_110);
  }
  if (pTStack_38 != (TypeGenericClassProto *)0x0) {
    uVar2 = NULLC::StringHashContinue((pTStack_38->super_TypeBase).nameHash,"::");
    join_0x00000010_0x00000000_ = GetTypeConstructorName(pTStack_38);
    uVar2 = NULLC::StringHashContinue(uVar2,(char *)chain_3.scope,functionName_2.begin);
    uVar2 = NULLC::StringHashContinue(uVar2,"$");
    anon_unknown.dwarf_6f1cc::LookupFunctionChainByName((FunctionLookupChain *)local_170,ctx,uVar2);
    while (bVar3 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                             ((FunctionLookupChain *)local_170), bVar3 != 0) {
      if (noArguments) {
        pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator->
                           ((FunctionLookupChain *)local_170);
        bVar1 = SmallArray<ArgumentData,_4U>::empty(&pFVar4->arguments);
        if (bVar1) goto LAB_001a7bbc;
        pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator->
                           ((FunctionLookupChain *)local_170);
        pAVar5 = SmallArray<ArgumentData,_4U>::operator[](&pFVar4->arguments,0);
        if (pAVar5->value != (ExprBase *)0x0) goto LAB_001a7bbc;
      }
      else {
LAB_001a7bbc:
        ArrayView<FunctionData*>::ArrayView<32u>(local_180,functions);
        pFVar4 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator*
                           ((FunctionLookupChain *)local_170);
        functions_03._12_4_ = 0;
        functions_03._0_12_ = local_180._0_12_;
        bVar1 = ContainsSameOverload(functions_03,pFVar4);
        if (!bVar1) {
          local_188 = anon_unknown.dwarf_6f1cc::FunctionLookupChain::operator*
                                ((FunctionLookupChain *)local_170);
          SmallArray<FunctionData_*,_32U>::push_back(functions,&local_188);
        }
      }
      anon_unknown.dwarf_6f1cc::FunctionLookupChain::next
                (&local_1a0,(FunctionLookupChain *)local_170);
    }
  }
  bVar1 = SmallArray<FunctionData_*,_32U>::empty(functions);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool GetTypeConstructorFunctions(ExpressionContext &ctx, TypeBase *type, bool noArguments, SmallArray<FunctionData*, 32> &functions)
{
	TypeClass *classType = getType<TypeClass>(type);
	TypeGenericClassProto *typeGenericClassProto = getType<TypeGenericClassProto>(type);

	if(classType && classType->proto)
		typeGenericClassProto = classType->proto;

	unsigned hash = NULLC::StringHashContinue(type->nameHash, "::");

	if(classType)
	{
		InplaceStr functionName = GetTypeConstructorName(classType);

		hash = NULLC::StringHashContinue(hash, functionName.begin, functionName.end);
	}
	else
	{
		hash = NULLC::StringHashContinue(hash, type->name.begin, type->name.end);
	}

	for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, hash); chain; chain = chain.next())
	{
		if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
			continue;

		if(chain->scope->ownerType != type)
			continue;

		if(!ContainsSameOverload(functions, *chain))
			functions.push_back(*chain);
	}

	if(typeGenericClassProto)
	{
		// Look for a member function in a generic class base and instantiate them
		unsigned hash = NULLC::StringHashContinue(typeGenericClassProto->nameHash, "::");

		InplaceStr functionName = GetTypeConstructorName(typeGenericClassProto);

		hash = NULLC::StringHashContinue(hash, functionName.begin, functionName.end);

		for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, hash); chain; chain = chain.next())
		{
			if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
				continue;

			if(!ContainsSameOverload(functions, *chain))
				functions.push_back(*chain);
		}
	}

	for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, NULLC::StringHashContinue(hash, "$")); chain; chain = chain.next())
	{
		if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
			continue;

		if(chain->scope->ownerType != type)
			continue;

		if(!ContainsSameOverload(functions, *chain))
			functions.push_back(*chain);
	}

	if(typeGenericClassProto)
	{
		// Look for a member function in a generic class base and instantiate them
		unsigned hash = NULLC::StringHashContinue(typeGenericClassProto->nameHash, "::");

		InplaceStr functionName = GetTypeConstructorName(typeGenericClassProto);

		hash = NULLC::StringHashContinue(hash, functionName.begin, functionName.end);

		for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, NULLC::StringHashContinue(hash, "$")); chain; chain = chain.next())
		{
			if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
				continue;

			if(!ContainsSameOverload(functions, *chain))
				functions.push_back(*chain);
		}
	}

	return !functions.empty();
}